

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::Float32ConstOpnd::IsEqualInternal(Float32ConstOpnd *this,Opnd *opnd)

{
  float fVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Float32ConstOpnd *pFVar5;
  
  if ((this->super_Opnd).m_kind != OpndKindFloat32Const) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x74c,"(m_kind == OpndKindFloat32Const)","m_kind == OpndKindFloat32Const");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((opnd->m_kind == OpndKindFloat32Const) && ((this->super_Opnd).m_type == opnd->m_type)) {
    fVar1 = this->m_value;
    pFVar5 = Opnd::AsFloat32ConstOpnd(opnd);
    bVar3 = (bool)(-(fVar1 == pFVar5->m_value) & 1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
Float32ConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindFloat32Const);
    if (!opnd->IsFloat32ConstOpnd() || this->GetType() != opnd->GetType() /* TODO: could this be turned into an assert*/)
    {
        return false;
    }

    return m_value == opnd->AsFloat32ConstOpnd()->m_value;
}